

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::Shutdown(void)

{
  if (DAT_00429c20 == '\x01') {
    DAT_00429c20 = '\0';
    (*(code *)*_Version_default_instance_)(&_Version_default_instance_);
  }
  if (DAT_00429d08 != (long *)0x0) {
    (**(code **)(*DAT_00429d08 + 8))();
  }
  if (DAT_00429c80 == '\x01') {
    DAT_00429c80 = '\0';
    (*(code *)*_CodeGeneratorRequest_default_instance_)(&_CodeGeneratorRequest_default_instance_);
  }
  if (DAT_00429d18 != (long *)0x0) {
    (**(code **)(*DAT_00429d18 + 8))();
  }
  if (DAT_00429cb8 == '\x01') {
    DAT_00429cb8 = '\0';
    (*(code *)*_CodeGeneratorResponse_File_default_instance_)
              (&_CodeGeneratorResponse_File_default_instance_);
  }
  if (DAT_00429d28 != (long *)0x0) {
    (**(code **)(*DAT_00429d28 + 8))();
  }
  if (DAT_00429cf8 == '\x01') {
    DAT_00429cf8 = '\0';
    (*(code *)*_CodeGeneratorResponse_default_instance_)(&_CodeGeneratorResponse_default_instance_);
  }
  if (DAT_00429d38 != (long *)0x0) {
    (**(code **)(*DAT_00429d38 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Version_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _CodeGeneratorRequest_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _CodeGeneratorResponse_File_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _CodeGeneratorResponse_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
}